

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O2

void aom_smooth_h_predictor_16x64_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  ulong uVar1;
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  int left_offset;
  ulong uVar12;
  uint uVar13;
  short sVar14;
  short sVar16;
  undefined1 auVar15 [16];
  ushort uVar17;
  ushort uVar18;
  ushort uVar19;
  ushort uVar20;
  ushort uVar21;
  ushort uVar22;
  ushort uVar23;
  ushort uVar24;
  ushort uVar25;
  ushort uVar26;
  ushort uVar27;
  ushort uVar28;
  ushort uVar29;
  ushort uVar30;
  ushort uVar31;
  ushort uVar32;
  ushort uVar33;
  ushort uVar34;
  ushort uVar36;
  ushort uVar37;
  ushort uVar38;
  ushort uVar39;
  ushort uVar40;
  ushort uVar41;
  ushort uVar42;
  ushort uVar43;
  ushort uVar44;
  ushort uVar45;
  ushort uVar46;
  ushort uVar47;
  undefined1 auVar35 [16];
  ushort uVar48;
  ushort uVar49;
  
  auVar15 = pshuflw(ZEXT116(top_row[0xf]),ZEXT116(top_row[0xf]),0);
  sVar14 = auVar15._0_2_;
  sVar16 = auVar15._2_2_;
  for (uVar12 = 0; uVar12 < 0x40; uVar12 = uVar12 + 8) {
    uVar1 = *(ulong *)(left_column + uVar12);
    auVar2._8_6_ = 0;
    auVar2._0_8_ = uVar1;
    auVar2[0xe] = (char)(uVar1 >> 0x38);
    auVar3._8_4_ = 0;
    auVar3._0_8_ = uVar1;
    auVar3[0xc] = (char)(uVar1 >> 0x30);
    auVar3._13_2_ = auVar2._13_2_;
    auVar4._8_4_ = 0;
    auVar4._0_8_ = uVar1;
    auVar4._12_3_ = auVar3._12_3_;
    auVar5._8_2_ = 0;
    auVar5._0_8_ = uVar1;
    auVar5[10] = (char)(uVar1 >> 0x28);
    auVar5._11_4_ = auVar4._11_4_;
    auVar6._8_2_ = 0;
    auVar6._0_8_ = uVar1;
    auVar6._10_5_ = auVar5._10_5_;
    auVar7[8] = (char)(uVar1 >> 0x20);
    auVar7._0_8_ = uVar1;
    auVar7._9_6_ = auVar6._9_6_;
    auVar9._7_8_ = 0;
    auVar9._0_7_ = auVar7._8_7_;
    auVar10._1_8_ = SUB158(auVar9 << 0x40,7);
    auVar10[0] = (char)(uVar1 >> 0x18);
    auVar10._9_6_ = 0;
    auVar11._1_10_ = SUB1510(auVar10 << 0x30,5);
    auVar11[0] = (char)(uVar1 >> 0x10);
    auVar11._11_4_ = 0;
    auVar8[2] = (char)(uVar1 >> 8);
    auVar8._0_2_ = (ushort)uVar1;
    auVar8._3_12_ = SUB1512(auVar11 << 0x20,3);
    auVar15._0_2_ = (ushort)uVar1 & 0xff;
    auVar15._2_13_ = auVar8._2_13_;
    auVar15[0xf] = 0;
    for (uVar13 = 0x1000100; uVar13 < 0xf0e0f0f; uVar13 = uVar13 + 0x2020202) {
      auVar35._4_4_ = uVar13;
      auVar35._0_4_ = uVar13;
      auVar35._8_4_ = uVar13;
      auVar35._12_4_ = uVar13;
      auVar35 = pshufb(auVar15,auVar35);
      uVar17 = auVar35._0_2_ * 0xff + sVar14 + 0x80;
      uVar19 = auVar35._2_2_ * 0xe1 + sVar16 * 0x1f + 0x80;
      uVar21 = auVar35._4_2_ * 0xc4 + sVar14 * 0x3c + 0x80;
      uVar23 = auVar35._6_2_ * 0xaa + sVar16 * 0x56 + 0x80;
      uVar25 = auVar35._8_2_ * 0x91 + sVar14 * 0x6f + 0x80;
      uVar27 = auVar35._10_2_ * 0x7b + sVar16 * 0x85 + 0x80;
      uVar29 = auVar35._12_2_ * 0x66 + sVar14 * 0x9a + 0x80;
      uVar31 = auVar35._14_2_ * 0x54 + sVar16 * 0xac + 0x80;
      uVar33 = auVar35._0_2_ * 0x44 + sVar14 * 0xbc + 0x80;
      uVar36 = auVar35._2_2_ * 0x36 + sVar16 * 0xca + 0x80;
      uVar38 = auVar35._4_2_ * 0x2b + sVar14 * 0xd5 + 0x80;
      uVar40 = auVar35._6_2_ * 0x21 + sVar16 * 0xdf + 0x80;
      uVar42 = auVar35._8_2_ * 0x1a + sVar14 * 0xe6 + 0x80;
      uVar44 = auVar35._10_2_ * 0x14 + sVar16 * 0xec + 0x80;
      uVar46 = auVar35._12_2_ * 0x11 + sVar14 * 0xef + 0x80;
      uVar48 = auVar35._14_2_ * 0x10 + sVar16 * 0xf0 + 0x80;
      uVar18 = uVar17 >> 8;
      uVar20 = uVar19 >> 8;
      uVar22 = uVar21 >> 8;
      uVar24 = uVar23 >> 8;
      uVar26 = uVar25 >> 8;
      uVar28 = uVar27 >> 8;
      uVar30 = uVar29 >> 8;
      uVar32 = uVar31 >> 8;
      uVar34 = uVar33 >> 8;
      uVar37 = uVar36 >> 8;
      uVar39 = uVar38 >> 8;
      uVar41 = uVar40 >> 8;
      uVar43 = uVar42 >> 8;
      uVar45 = uVar44 >> 8;
      uVar47 = uVar46 >> 8;
      uVar49 = uVar48 >> 8;
      *dst = (uVar18 != 0) * (uVar18 < 0x100) * (char)(uVar17 >> 8) - (0xff < uVar18);
      dst[1] = (uVar20 != 0) * (uVar20 < 0x100) * (char)(uVar19 >> 8) - (0xff < uVar20);
      dst[2] = (uVar22 != 0) * (uVar22 < 0x100) * (char)(uVar21 >> 8) - (0xff < uVar22);
      dst[3] = (uVar24 != 0) * (uVar24 < 0x100) * (char)(uVar23 >> 8) - (0xff < uVar24);
      dst[4] = (uVar26 != 0) * (uVar26 < 0x100) * (char)(uVar25 >> 8) - (0xff < uVar26);
      dst[5] = (uVar28 != 0) * (uVar28 < 0x100) * (char)(uVar27 >> 8) - (0xff < uVar28);
      dst[6] = (uVar30 != 0) * (uVar30 < 0x100) * (char)(uVar29 >> 8) - (0xff < uVar30);
      dst[7] = (uVar32 != 0) * (uVar32 < 0x100) * (char)(uVar31 >> 8) - (0xff < uVar32);
      dst[8] = (uVar34 != 0) * (uVar34 < 0x100) * (char)(uVar33 >> 8) - (0xff < uVar34);
      dst[9] = (uVar37 != 0) * (uVar37 < 0x100) * (char)(uVar36 >> 8) - (0xff < uVar37);
      dst[10] = (uVar39 != 0) * (uVar39 < 0x100) * (char)(uVar38 >> 8) - (0xff < uVar39);
      dst[0xb] = (uVar41 != 0) * (uVar41 < 0x100) * (char)(uVar40 >> 8) - (0xff < uVar41);
      dst[0xc] = (uVar43 != 0) * (uVar43 < 0x100) * (char)(uVar42 >> 8) - (0xff < uVar43);
      dst[0xd] = (uVar45 != 0) * (uVar45 < 0x100) * (char)(uVar44 >> 8) - (0xff < uVar45);
      dst[0xe] = (uVar47 != 0) * (uVar47 < 0x100) * (char)(uVar46 >> 8) - (0xff < uVar47);
      dst[0xf] = (uVar49 != 0) * (uVar49 < 0x100) * (char)(uVar48 >> 8) - (0xff < uVar49);
      dst = dst + stride;
    }
  }
  return;
}

Assistant:

void aom_smooth_h_predictor_16x64_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  const __m128i top_right = _mm_set1_epi16(top_row[15]);
  const __m128i weights = LoadUnaligned16(smooth_weights + 12);
  const __m128i scale = _mm_set1_epi16(1 << SMOOTH_WEIGHT_LOG2_SCALE);
  const __m128i weights1 = cvtepu8_epi16(weights);
  const __m128i weights2 = cvtepu8_epi16(_mm_srli_si128(weights, 8));
  const __m128i inverted_weights1 = _mm_sub_epi16(scale, weights1);
  const __m128i inverted_weights2 = _mm_sub_epi16(scale, weights2);
  const __m128i scaled_top_right1 =
      _mm_mullo_epi16(inverted_weights1, top_right);
  const __m128i scaled_top_right2 =
      _mm_mullo_epi16(inverted_weights2, top_right);
  const __m128i round = _mm_set1_epi16(1 << (SMOOTH_WEIGHT_LOG2_SCALE - 1));
  for (int left_offset = 0; left_offset < 64; left_offset += 8) {
    const __m128i left = cvtepu8_epi16(LoadLo8(left_column + left_offset));
    for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
      const __m128i y_select = _mm_set1_epi32(y_mask);
      const __m128i left_y = _mm_shuffle_epi8(left, y_select);
      write_smooth_directional_sum16(dst, left_y, left_y, weights1, weights2,
                                     scaled_top_right1, scaled_top_right2,
                                     round);
      dst += stride;
    }
  }
}